

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::dump(string_t *__return_storage_ptr__,
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
      *this,int indent)

{
  int iVar1;
  locale *__other;
  DecimalSeparator *__f;
  bool pretty_print;
  stringstream ss;
  locale local_1c0;
  locale local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  if (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
      ::dump(int)::loc == '\0') {
    iVar1 = __cxa_guard_acquire(&basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                                 ::dump(int)::loc);
    if (iVar1 != 0) {
      std::locale::locale(&local_1c0);
      __other = (locale *)operator_new(0x18);
      std::__cxx11::numpunct<char>::numpunct((ulong)__other);
      __other->_M_impl = (_Impl *)&PTR__numpunct_00119d10;
      std::locale::locale<nlohmann::(anonymous_namespace)::DecimalSeparator>(&local_1c0,__other,__f)
      ;
      std::locale::~locale(&local_1c0);
      __cxa_atexit(std::locale::~locale,&dump::loc,&__dso_handle);
      __cxa_guard_release(&basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                           ::dump(int)::loc);
    }
  }
  std::ios::imbue(&local_1b8);
  std::locale::~locale(&local_1b8);
  *(undefined8 *)((long)&uStack_1a8 + *(long *)(local_1b0 + -0x18)) = 0xf;
  pretty_print = -1 < indent;
  if (!pretty_print) {
    indent = 0;
  }
  dump(this,local_1a0,pretty_print,indent,0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string_t dump(const int indent = -1) const
    {
        std::stringstream ss;
        // fix locale problems
        const static std::locale loc(std::locale(), new DecimalSeparator);
        ss.imbue(loc);

        // 6, 15 or 16 digits of precision allows round-trip IEEE 754
        // string->float->string, string->double->string or string->long
        // double->string; to be safe, we read this value from
        // std::numeric_limits<number_float_t>::digits10
        ss.precision(std::numeric_limits<double>::digits10);

        if (indent >= 0)
        {
            dump(ss, true, static_cast<unsigned int>(indent));
        }
        else
        {
            dump(ss, false, 0);
        }

        return ss.str();
    }